

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O2

index_t __thiscall xLearn::DMatrix::max_feat_or_field(DMatrix *this,bool is_feat)

{
  uint uVar1;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  pointer pNVar5;
  
  uVar3 = 0;
  for (uVar4 = 0; uVar4 != this->row_length; uVar4 = uVar4 + 1) {
    pvVar2 = (this->row).
             super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar4];
    for (pNVar5 = (pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pNVar5 != *(pointer *)
                   ((long)&(pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)
                           ._M_impl.super__Vector_impl_data + 8); pNVar5 = pNVar5 + 1) {
      uVar1 = *(uint *)((long)&pNVar5->field_id +
                       (ulong)(uint)((int)CONCAT71(in_register_00000031,is_feat) << 2));
      if (uVar3 < uVar1) {
        uVar3 = uVar1;
      }
    }
  }
  return uVar3;
}

Assistant:

inline index_t max_feat_or_field(bool is_feat) const {
    index_t max = 0;
    for (size_t i = 0; i < row_length; ++i) {
      SparseRow* sr = this->row[i];
      for (SparseRow::const_iterator iter = sr->begin();
           iter != sr->end(); ++iter) {
        if (is_feat) {  // feature
          if (iter->feat_id > max) {
            max = iter->feat_id;
          }
        } else {  // field
          if (iter->field_id > max) {
            max = iter->field_id;
          }
        }
      }
    }
    return max;
  }